

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_52ce5e5c fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  char *__last;
  void *__s2;
  vector<char,std::allocator<char>> *this;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined4 *__src;
  ulong uVar4;
  char *__first;
  idx_t string_position;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong __n;
  anon_union_16_2_67f50693_for_value aVar8;
  string_t data;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  undefined8 local_78;
  char *pcStack_70;
  Vector *local_68;
  void *local_60;
  vector<char,std::allocator<char>> *local_58;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  char *local_38;
  
  local_48 = b.value._8_8_;
  local_50 = b.value._0_8_;
  local_38 = a.value._8_8_;
  local_40 = a.value._0_8_;
  local_58 = (vector<char,std::allocator<char>> *)fun.buffer;
  local_68 = fun.result;
  local_78 = c.value._0_8_;
  pcStack_70 = c.value.pointer.ptr;
  __first = local_38;
  if (a.value._0_4_ < 0xd) {
    __first = (char *)((long)&local_40 + 4);
  }
  local_60 = local_48;
  if (b.value._0_4_ < 0xd) {
    local_60 = (void *)((long)&local_50 + 4);
  }
  if ((c.value._0_8_ & 0xffffffff) < 0xd) {
    c.value.pointer.ptr = (char *)((long)&local_78 + 4);
  }
  uVar7 = (ulong)a.value._0_4_;
  __n = local_50 & 0xffffffff;
  if (*(pointer *)(local_58 + 8) != *(pointer *)local_58) {
    *(pointer *)(local_58 + 8) = *(pointer *)local_58;
  }
  while( true ) {
    __s2 = local_60;
    uVar6 = uVar7;
    if (b.value._0_4_ != 0) {
      uVar5 = 0;
      uVar4 = uVar7;
      while ((uVar6 = uVar7, __n <= uVar4 &&
             (iVar1 = bcmp(__first + uVar5,__s2,__n), uVar6 = uVar5, iVar1 != 0))) {
        uVar5 = uVar5 + 1;
        uVar4 = uVar4 - 1;
      }
    }
    this = local_58;
    __last = __first + uVar6;
    pcVar3 = __last;
    ::std::vector<char,std::allocator<char>>::insert<char_const*,void>
              (local_58,(const_iterator)*(char **)(local_58 + 8),__first,__last);
    if (uVar7 == uVar6) break;
    ::std::vector<char,std::allocator<char>>::insert<char_const*,void>
              (this,(const_iterator)*(char **)(this + 8),c.value.pointer.ptr,
               (char *)((long)c.value.pointer.ptr + (c.value._0_8_ & 0xffffffff)));
    __first = __last + __n;
    uVar7 = uVar7 - (uVar6 + __n);
  }
  __src = *(undefined4 **)this;
  uVar2 = (int)*(undefined8 *)(this + 8) - (int)__src;
  if (uVar2 < 0xd) {
    local_7c = 0;
    uStack_84 = 0;
    uStack_80 = 0;
    if (uVar2 == 0) {
      __src = (undefined4 *)0x0;
    }
    else {
      switchD_00916250::default(&uStack_84,__src,(ulong)(uVar2 & 0xf));
      __src = (undefined4 *)CONCAT44(local_7c,uStack_80);
    }
  }
  else {
    uStack_84 = *__src;
  }
  data.value.pointer.ptr = pcVar3;
  data.value._0_8_ = __src;
  aVar8.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddString((StringVector *)local_68,(Vector *)CONCAT44(uStack_84,uVar2),data);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar8.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}